

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IncludeDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IncludeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Token directive;
  IncludeDirectiveSyntax *pIVar1;
  long in_RDX;
  Token *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pIVar1 = (IncludeDirectiveSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  directive.info = (Info *)in_RSI;
  directive.kind = (short)in_RDX;
  directive._2_1_ = (char)((ulong)in_RDX >> 0x10);
  directive.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  directive.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::IncludeDirectiveSyntax::IncludeDirectiveSyntax
            (*(IncludeDirectiveSyntax **)(in_RDX + 8),directive,*in_RSI);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }